

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O3

int Abc_CexCountOnes(Abc_Cex_t *p)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  iVar2 = p->nBits >> 5;
  uVar4 = (uint)((p->nBits & 0x1fU) != 0);
  uVar1 = uVar4 + iVar2;
  if (uVar1 != 0 && SCARRY4(uVar4,iVar2) == (int)uVar1 < 0) {
    uVar3 = 0;
    iVar2 = 0;
    do {
      uVar4 = (&p[1].iPo)[uVar3] - ((uint)(&p[1].iPo)[uVar3] >> 1 & 0x55555555);
      uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
      iVar2 = iVar2 + (((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    return iVar2;
  }
  return 0;
}

Assistant:

int Abc_CexCountOnes( Abc_Cex_t * p )
{
    int nWords = Abc_BitWordNum( p->nBits );
    int i, Count = 0;
    for ( i = 0; i < nWords; i++ )
        Count += Abc_CexOnes32( p->pData[i] );
    return Count;
}